

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

void __thiscall llvm::detail::IEEEFloat::IEEEFloat(IEEEFloat *this,IEEEFloat *rhs)

{
  fltSemantics *pfVar1;
  integerPart *piVar2;
  uint uVar3;
  
  pfVar1 = rhs->semantics;
  this->semantics = pfVar1;
  uVar3 = pfVar1->precision + 0x40;
  if (0x7f < uVar3) {
    piVar2 = (integerPart *)operator_new__((ulong)(uVar3 >> 3 & 0xfffffff8));
    (this->significand).parts = piVar2;
  }
  assign(this,rhs);
  return;
}

Assistant:

IEEEFloat::IEEEFloat(const IEEEFloat &rhs) {
  initialize(rhs.semantics);
  assign(rhs);
}